

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lateral_binder.cpp
# Opt level: O2

void __thiscall
duckdb::ExpressionDepthReducerRecursive::VisitExpression
          (ExpressionDepthReducerRecursive *this,
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expression)

{
  ExpressionType EVar1;
  pointer pEVar2;
  BoundColumnRefExpression *expr;
  BoundSubqueryExpression *expr_00;
  
  pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (expression);
  EVar1 = (pEVar2->super_BaseExpression).type;
  pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (expression);
  if (EVar1 == BOUND_COLUMN_REF) {
    expr = BaseExpression::Cast<duckdb::BoundColumnRefExpression>(&pEVar2->super_BaseExpression);
    ReduceColumnRefDepth(expr,this->correlated_columns);
  }
  else if ((pEVar2->super_BaseExpression).type == SUBQUERY) {
    pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(expression);
    expr_00 = BaseExpression::Cast<duckdb::BoundSubqueryExpression>(&pEVar2->super_BaseExpression);
    ReduceExpressionSubquery(expr_00,this->correlated_columns);
  }
  BoundNodeVisitor::VisitExpression(&this->super_BoundNodeVisitor,expression);
  return;
}

Assistant:

void VisitExpression(unique_ptr<Expression> &expression) override {
		if (expression->GetExpressionType() == ExpressionType::BOUND_COLUMN_REF) {
			ReduceColumnRefDepth(expression->Cast<BoundColumnRefExpression>(), correlated_columns);
		} else if (expression->GetExpressionType() == ExpressionType::SUBQUERY) {
			ReduceExpressionSubquery(expression->Cast<BoundSubqueryExpression>(), correlated_columns);
		}
		BoundNodeVisitor::VisitExpression(expression);
	}